

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastStFldForCustomProperty(Lowerer *this,Instr *instr,LabelInstr **labelHelperRef)

{
  Func *func_00;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ValueType valueType;
  BailOutKind BVar4;
  uint uVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  SymOpnd *this_00;
  IndirOpnd *pIVar8;
  IntConstOpnd *src;
  LabelInstr *target;
  LabelInstr *local_70;
  LabelInstr *labelHelper;
  AutoReuseOpnd autoReuseObjectOpnd;
  RegOpnd *objectOpnd;
  Func *func;
  BailOutKind bailOutKind;
  ValueType objectValueType;
  PropertySym *propertySym;
  SymOpnd *symOpnd;
  LabelInstr **labelHelperRef_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2b,"(instr)","instr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (labelHelperRef == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2c,"(labelHelperRef)","labelHelperRef");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (*labelHelperRef != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2d,"(!*labelHelperRef)","!*labelHelperRef");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((instr->m_opcode == StFld) || (instr->m_opcode == StFldStrict)) {
    pOVar7 = IR::Instr::GetDst(instr);
    this_00 = IR::Opnd::AsSymOpnd(pOVar7);
    _bailOutKind = Sym::AsPropertySym(this_00->m_sym);
    if ((_bailOutKind->m_propertyId == 0x1a2) &&
       (bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00), bVar3)) {
      func._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   IR::SymOpnd::GetPropertyOwnerValueType(this_00);
      bVar3 = ValueType::IsLikelyRegExp((ValueType *)((long)&func + 6));
      if (bVar3) {
        bVar3 = IR::Instr::HasBailOutInfo(instr);
        if (bVar3) {
          func._0_4_ = IR::Instr::GetBailOutKind(instr);
          bVar3 = BailOutInfo::IsBailOutOnImplicitCalls((BailOutKind)func);
          if ((!bVar3) ||
             (BVar4 = IR::operator&((BailOutKind)func,BailOutKindBits), BVar4 != BailOutInvalid)) {
            return false;
          }
        }
        func_00 = instr->m_func;
        autoReuseObjectOpnd._16_8_ = IR::SymOpnd::CreatePropertyOwnerOpnd(this_00,func_00);
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&labelHelper,(Opnd *)autoReuseObjectOpnd._16_8_,func_00,true);
        local_70 = (LabelInstr *)0x0;
        bVar3 = IR::Opnd::IsNotTaggedValue((Opnd *)autoReuseObjectOpnd._16_8_);
        if (!bVar3) {
          local_70 = IR::LabelInstr::New(Label,func_00,true);
          *labelHelperRef = local_70;
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,(Opnd *)autoReuseObjectOpnd._16_8_,instr,local_70,false);
        }
        bVar3 = ValueType::IsObject((ValueType *)((long)&func + 6));
        if (!bVar3) {
          if (local_70 == (LabelInstr *)0x0) {
            local_70 = IR::LabelInstr::New(Label,func_00,true);
            *labelHelperRef = local_70;
          }
          pIVar8 = IR::IndirOpnd::New((RegOpnd *)autoReuseObjectOpnd._16_8_,0,TyUint64,func_00,false
                                     );
          pOVar7 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
          InsertCompareBranch(this,&pIVar8->super_Opnd,pOVar7,BrNeq_A,local_70,instr,false);
          uVar2 = autoReuseObjectOpnd._16_8_;
          valueType = ValueType::ToDefiniteObject((ValueType *)((long)&func + 6));
          IR::Opnd::SetValueType((Opnd *)uVar2,valueType);
        }
        uVar2 = autoReuseObjectOpnd._16_8_;
        uVar5 = Js::JavascriptRegExp::GetOffsetOfLastIndexVar();
        pIVar8 = IR::IndirOpnd::New((RegOpnd *)uVar2,uVar5,TyVar,func_00,false);
        pOVar7 = IR::Instr::GetSrc1(instr);
        InsertMove(&pIVar8->super_Opnd,pOVar7,instr,true);
        uVar2 = autoReuseObjectOpnd._16_8_;
        uVar5 = Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag();
        pIVar8 = IR::IndirOpnd::New((RegOpnd *)uVar2,uVar5,TyUint32,func_00,false);
        src = IR::IntConstOpnd::New(0xfffffffe,TyUint32,func_00,true);
        InsertMove(&pIVar8->super_Opnd,&src->super_Opnd,instr,true);
        target = IR::Instr::GetOrCreateContinueLabel(instr,false);
        InsertBranch(Br,target,instr);
        this_local._7_1_ = true;
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&labelHelper);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Lowerer::GenerateFastStFldForCustomProperty(IR::Instr *const instr, IR::LabelInstr * *const labelHelperRef)
{
    Assert(instr);
    Assert(labelHelperRef);
    Assert(!*labelHelperRef);

    switch(instr->m_opcode)
    {
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
            break;

        default:
            return false;
    }

    IR::SymOpnd *const symOpnd = instr->GetDst()->AsSymOpnd();
    PropertySym *const propertySym = symOpnd->m_sym->AsPropertySym();
    if(propertySym->m_propertyId != Js::PropertyIds::lastIndex || !symOpnd->IsPropertySymOpnd())
    {
        return false;
    }

    const ValueType objectValueType(symOpnd->GetPropertyOwnerValueType());
    if(!objectValueType.IsLikelyRegExp())
    {
        return false;
    }

    if(instr->HasBailOutInfo())
    {
        const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if(!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind) || bailOutKind & IR::BailOutKindBits)
        {
            // Other bailout kinds will likely need bailout checks that would not be generated here. In particular, if a type
            // check is necessary here to guard against downstream property accesses on the same object, the type check will
            // fail and cause a bailout if the object is a RegExp object since the "lastIndex" property accesses are not cached.
            return false;
        }
    }

    Func *const func = instr->m_func;

    IR::RegOpnd *const objectOpnd = symOpnd->CreatePropertyOwnerOpnd(func);
    const IR::AutoReuseOpnd autoReuseObjectOpnd(objectOpnd, func);

    IR::LabelInstr *labelHelper = nullptr;
    if(!objectOpnd->IsNotTaggedValue())
    {
        //     test object, 1
        //     jnz $helper
        if(!labelHelper)
        {
            *labelHelperRef = labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        m_lowererMD.GenerateObjectTest(objectOpnd, instr, labelHelper);
    }

    if(!objectValueType.IsObject())
    {
        //     cmp [object], Js::JavascriptRegExp::vtable
        //     jne $helper
        if(!labelHelper)
        {
            *labelHelperRef = labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        InsertCompareBranch(
            IR::IndirOpnd::New(objectOpnd, 0, TyMachPtr, func),
            LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp),
            Js::OpCode::BrNeq_A,
            labelHelper,
            instr);
        objectOpnd->SetValueType(objectValueType.ToDefiniteObject());
    }

    //     mov [object + offset(lastIndexVar)], src
    //     mov [object + offset(lastIndexOrFlag)], Js::JavascriptRegExp::NotCachedValue
    //     jmp $done
    InsertMove(
        IR::IndirOpnd::New(objectOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), TyVar, func),
        instr->GetSrc1(),
        instr);
    InsertMove(
        IR::IndirOpnd::New(objectOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), TyUint32, func),
        IR::IntConstOpnd::New(Js::JavascriptRegExp::NotCachedValue, TyUint32, func, true),
        instr);
    InsertBranch(Js::OpCode::Br, instr->GetOrCreateContinueLabel(), instr);

    return true;
}